

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

Vector3d * __thiscall OpenMD::Thermo::getHeatFlux(Vector3d *__return_storage_ptr__,Thermo *this)

{
  double dVar1;
  int iVar2;
  Snapshot *pSVar3;
  RealType RVar4;
  uint i;
  Molecule *pMVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  Vector3d *pVVar12;
  long lVar13;
  StuntDouble *pSVar14;
  pointer ppSVar15;
  byte bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 uVar21;
  Vector3d angMom;
  MoleculeIterator miter;
  Vector<double,_3U> result;
  Mat3x3d I;
  Vector<double,_3U> result_1;
  double local_178 [4];
  double local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  double local_138;
  Snapshot *local_130;
  Vector3d *local_128;
  MoleculeIterator local_120;
  double local_118;
  double dStack_110;
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [10];
  Vector3d local_78 [3];
  
  bVar16 = 0;
  local_130 = this->info_->sman_->currentSnapshot_;
  local_120._M_node = (_Base_ptr)0x0;
  local_178[2] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_c8[8] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_138 = (double)OpenMD::V3Zero._16_8_;
  local_148._8_8_ = OpenMD::V3Zero._8_8_;
  local_148._0_8_ = OpenMD::V3Zero._0_8_;
  local_128 = __return_storage_ptr__;
  pMVar5 = SimInfo::beginMolecule(this->info_,&local_120);
  if (pMVar5 != (Molecule *)0x0) {
    do {
      ppSVar15 = (pMVar5->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar15 ==
            (pMVar5->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar14 = (StuntDouble *)0x0;
        }
        else {
          pSVar14 = *ppSVar15;
        }
        if (pSVar14 == (StuntDouble *)0x0) break;
        pSVar3 = pSVar14->snapshotMan_->currentSnapshot_;
        lVar11 = (long)pSVar14->localIndex_;
        lVar8 = *(long *)((long)&(pSVar3->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
        pdVar7 = (double *)(lVar8 + lVar11 * 0x18);
        local_118 = *pdVar7;
        dStack_110 = pdVar7[1];
        dVar1 = *(double *)(lVar8 + 0x10 + lVar11 * 0x18);
        dVar20 = (dVar1 * dVar1 + local_118 * local_118 + dStack_110 * dStack_110) * pSVar14->mass_;
        uVar21 = 0;
        if (pSVar14->objType_ - otDAtom < 2) {
          uStack_150 = 0;
          lVar8 = *(long *)((long)&(pSVar3->atomData).angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
          local_178[2] = *(double *)(lVar8 + 0x10 + lVar11 * 0x18);
          pdVar7 = (double *)(lVar8 + lVar11 * 0x18);
          local_178[0] = *pdVar7;
          local_178[1] = pdVar7[1];
          local_158 = dVar20;
          (*pSVar14->_vptr_StuntDouble[5])(local_78,pSVar14);
          pVVar12 = local_78;
          pdVar7 = local_c8;
          for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
            *pdVar7 = (pVVar12->super_Vector<double,_3U>).data_[0];
            pVVar12 = (Vector3d *)((long)pVVar12 + ((ulong)bVar16 * -2 + 1) * 8);
            pdVar7 = pdVar7 + (ulong)bVar16 * -2 + 1;
          }
          if (pSVar14->linear_ == true) {
            iVar2 = pSVar14->linearAxis_;
            uVar9 = (ulong)(((iVar2 + 1) / 3) * -3 + iVar2 + 1);
            uVar6 = (ulong)(iVar2 + ((iVar2 + 2) / 3) * -3 + 2);
            dVar20 = (local_178[uVar9] * local_178[uVar9]) / local_c8[uVar9 * 4];
            dVar17 = local_178[uVar6] * local_178[uVar6];
            pdVar7 = local_c8 + uVar6 * 4;
          }
          else {
            auVar18._0_8_ = local_178[0] * local_178[0];
            auVar18._8_8_ = local_178[1] * local_178[1];
            auVar19._8_4_ = SUB84(local_c8[4],0);
            auVar19._0_8_ = local_c8[0];
            auVar19._12_4_ = (int)((ulong)local_c8[4] >> 0x20);
            auVar19 = divpd(auVar18,auVar19);
            dVar20 = auVar19._8_8_ + auVar19._0_8_;
            dVar17 = local_178[2] * local_178[2];
            pdVar7 = local_c8 + 8;
          }
          dVar20 = local_158 + dVar17 / *pdVar7 + dVar20;
          uVar21 = uStack_150;
        }
        if (pSVar14->objType_ == otRigidBody) {
          local_158 = dVar20;
          uStack_150 = uVar21;
          lVar11 = __dynamic_cast(pSVar14,&StuntDouble::typeinfo,&RigidBody::typeinfo,0);
          plVar10 = *(long **)(lVar11 + 0x128);
          lVar8 = 0;
          if (plVar10 != *(long **)(lVar11 + 0x130)) {
            lVar8 = *plVar10;
          }
          dVar20 = local_158;
          if (lVar8 == 0) {
            dVar17 = 0.0;
          }
          else {
            dVar17 = 0.0;
            do {
              plVar10 = plVar10 + 1;
              if (plVar10 == *(long **)(lVar11 + 0x130)) {
                lVar13 = 0;
              }
              else {
                lVar13 = *plVar10;
              }
              dVar17 = dVar17 + *(double *)
                                 (*(long *)(*(long *)(*(long *)(lVar8 + 0x18) + 0x18) + 0x90 +
                                           *(long *)(lVar8 + 0x10)) +
                                 (long)*(int *)(lVar8 + 0x30) * 8);
              lVar8 = lVar13;
            } while (lVar13 != 0);
          }
        }
        else {
          dVar17 = *(double *)
                    (*(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).
                                      particlePot.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + pSVar14->storage_) +
                    (long)pSVar14->localIndex_ * 8);
        }
        dVar17 = (dVar20 + dVar17 * 0.0004184) * 0.5;
        dVar20 = dVar17 * dStack_110 + (double)local_148._8_8_;
        local_148._8_4_ = SUB84(dVar20,0);
        local_148._0_8_ = dVar17 * local_118 + (double)local_148._0_8_;
        local_148._12_4_ = (int)((ulong)dVar20 >> 0x20);
        local_138 = dVar17 * dVar1 + local_138;
        ppSVar15 = ppSVar15 + 1;
      }
      pMVar5 = SimInfo::nextMolecule(this->info_,&local_120);
    } while (pMVar5 != (Molecule *)0x0);
  }
  Snapshot::getConductiveHeatFlux(local_78,local_130);
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar8 = 0;
  do {
    local_e8[lVar8] = local_78[0].super_Vector<double,_3U>.data_[lVar8] * 0.0004184;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  lVar8 = 0;
  do {
    local_108[lVar8] = local_e8[lVar8] + *(double *)(local_148 + lVar8 * 8);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  RVar4 = Snapshot::getVolume(this->info_->sman_->currentSnapshot_);
  local_78[0].super_Vector<double,_3U>.data_[0] = 0.0;
  local_78[0].super_Vector<double,_3U>.data_[1] = 0.0;
  local_78[0].super_Vector<double,_3U>.data_[2] = 0.0;
  lVar8 = 0;
  do {
    local_78[0].super_Vector<double,_3U>.data_[lVar8] = local_108[lVar8] / RVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  (local_128->super_Vector<double,_3U>).data_[2] = local_78[0].super_Vector<double,_3U>.data_[2];
  (local_128->super_Vector<double,_3U>).data_[0] = local_78[0].super_Vector<double,_3U>.data_[0];
  (local_128->super_Vector<double,_3U>).data_[1] = local_78[0].super_Vector<double,_3U>.data_[1];
  return local_128;
}

Assistant:

Vector3d Thermo::getHeatFlux() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SimInfo::MoleculeIterator miter;
    vector<StuntDouble*>::iterator iiter;
    Molecule* mol;
    StuntDouble* sd;
    RigidBody::AtomIterator ai;
    Atom* atom;
    Vector3d vel;
    Vector3d angMom;
    Mat3x3d I;
    int i;
    int j;
    int k;
    RealType mass;

    Vector3d x_a;
    RealType kinetic;
    RealType potential;
    RealType eatom;
    // Convective portion of the heat flux
    Vector3d heatFluxJc = V3Zero;

    /* Calculate convective portion of the heat flux */
    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        mass = sd->getMass();
        vel  = sd->getVel();

        kinetic = mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

        if (sd->isDirectional()) {
          angMom = sd->getJ();
          I      = sd->getI();

          if (sd->isLinear()) {
            i = sd->linearAxis();
            j = (i + 1) % 3;
            k = (i + 2) % 3;
            kinetic += angMom[j] * angMom[j] / I(j, j) +
                       angMom[k] * angMom[k] / I(k, k);
          } else {
            kinetic += angMom[0] * angMom[0] / I(0, 0) +
                       angMom[1] * angMom[1] / I(1, 1) +
                       angMom[2] * angMom[2] / I(2, 2);
          }
        }

        potential = 0.0;

        if (sd->isRigidBody()) {
          RigidBody* rb = dynamic_cast<RigidBody*>(sd);
          for (atom = rb->beginAtom(ai); atom != NULL;
               atom = rb->nextAtom(ai)) {
            potential += atom->getParticlePot();
          }
        } else {
          potential = sd->getParticlePot();
        }

        potential *= Constants::energyConvert;  // amu A^2/fs^2
        // The potential may not be a 1/2 factor
        eatom = (kinetic + potential) / 2.0;  // amu A^2/fs^2
        heatFluxJc[0] += eatom * vel[0];      // amu A^3/fs^3
        heatFluxJc[1] += eatom * vel[1];      // amu A^3/fs^3
        heatFluxJc[2] += eatom * vel[2];      // amu A^3/fs^3
      }
    }

    /* The J_v vector is reduced in the forceManager so everyone has
     *  the global Jv. Jc is computed over the local atoms and must be
     *  reduced among all processors.
     */
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &heatFluxJc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // (kcal/mol * A/fs) * conversion => (amu A^3)/fs^3

    Vector3d heatFluxJv =
        currSnapshot->getConductiveHeatFlux() * Constants::energyConvert;

    // Correct for the fact the flux is 1/V (Jc + Jv)
    return (heatFluxJv + heatFluxJc) / this->getVolume();  // amu / fs^3
  }